

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cc
# Opt level: O1

uint __thiscall
RigidBodyDynamics::Model::AppendBody
          (Model *this,SpatialTransform *joint_frame,Joint *joint,Body *body,string *body_name)

{
  pointer pcVar1;
  uint uVar2;
  string local_50;
  
  uVar2 = this->previously_added_body_id;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  pcVar1 = (body_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + body_name->_M_string_length);
  uVar2 = AddBody(this,uVar2,joint_frame,joint,body,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return uVar2;
}

Assistant:

unsigned int Model::AppendBody (
  const Math::SpatialTransform &joint_frame,
  const Joint &joint,
  const Body &body,
  std::string body_name)
{
  return Model::AddBody (previously_added_body_id,
                         joint_frame,
                         joint,
                         body,
                         body_name);
}